

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

int av1_tpl_setup_stats(AV1_COMP *cpi,int gop_eval,EncodeFrameParams *frame_params)

{
  TplParams *tpl_data;
  GF_GROUP *gf_group;
  TplBuffers *tpl_tmp_buffers;
  scale_factors *sf;
  int *piVar1;
  FRAME_TYPE FVar2;
  FRAME_UPDATE_TYPE update_type;
  TX_SIZE tx_size;
  byte bVar3;
  aom_enc_pass aVar4;
  aom_bit_depth_t bit_depth;
  AV1_PRIMARY *pAVar5;
  AV1_PRIMARY *pAVar6;
  RefCntBuffer *pRVar7;
  TplDepFrame *pTVar8;
  TplDepFrame *pTVar9;
  TplDepFrame *pTVar10;
  STATS_BUFFER_CTX *pSVar11;
  uint uVar12;
  BLOCK_SIZE BVar13;
  int map_idx;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  lookahead_entry *plVar21;
  YV12_BUFFER_CONFIG *pYVar22;
  uint8_t *puVar23;
  int16_t *piVar24;
  tran_low_t *ptVar25;
  int i_3;
  int iVar26;
  long lVar27;
  ulong uVar28;
  FIRSTPASS_STATS *pFVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  EncodeFrameParams *pEVar33;
  long lVar34;
  byte bVar35;
  uint uVar36;
  EncodeFrameParams *pEVar37;
  AV1_PRIMARY *pAVar38;
  FIRSTPASS_STATS *pFVar39;
  int i;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  int mi_col;
  int iVar43;
  uint32_t uVar44;
  bool bVar45;
  bool bVar46;
  double dVar47;
  double dVar48;
  uint auStackY_1e248 [30688];
  int local_284;
  ulong local_280;
  long local_258;
  RefFrameMapPair ref_frame_map_pairs [8];
  int ref_picture_map [8];
  int remapped_ref_idx [8];
  EncodeFrameParams frame_params_1;
  FRAME_DIFF local_90;
  EncodeFrameParams this_frame_params;
  
  bVar35 = 0;
  pAVar5 = cpi->ppi;
  pEVar33 = frame_params;
  pEVar37 = &this_frame_params;
  for (lVar27 = 0x13; lVar27 != 0; lVar27 = lVar27 + -1) {
    pEVar37->error_resilient_mode = pEVar33->error_resilient_mode;
    pEVar33 = (EncodeFrameParams *)&pEVar33->frame_type;
    pEVar37 = (EncodeFrameParams *)&pEVar37->frame_type;
  }
  tpl_data = &pAVar5->tpl_data;
  if (cpi->superres_mode == AOM_SUPERRES_NONE) {
    gf_group = &pAVar5->gf_group;
    (cpi->common).current_frame.frame_type = frame_params->frame_type;
    for (uVar32 = (ulong)cpi->gf_frame_index; (long)uVar32 < (long)(pAVar5->gf_group).size;
        uVar32 = uVar32 + 1) {
      (cpi->common).current_frame.frame_type = (pAVar5->gf_group).frame_type[uVar32];
      av1_configure_buffer_updates
                (cpi,&this_frame_params.refresh_frame,(pAVar5->gf_group).update_type[uVar32],
                 (pAVar5->gf_group).refbuf_state[uVar32],0);
      (cpi->refresh_frame).alt_ref_frame = this_frame_params.refresh_frame.alt_ref_frame;
      (cpi->refresh_frame).golden_frame = this_frame_params.refresh_frame.golden_frame;
      (cpi->refresh_frame).bwd_ref_frame = this_frame_params.refresh_frame.bwd_ref_frame;
    }
    pAVar6 = cpi->ppi;
    if ((pAVar6->gf_group).update_type[cpi->gf_frame_index] == '\0') {
      ref_frame_map_pairs[7].pyr_level = -1;
      ref_frame_map_pairs[6].pyr_level = -1;
      ref_frame_map_pairs[6].disp_order = -1;
      ref_frame_map_pairs[7].disp_order = -1;
      ref_frame_map_pairs[5].pyr_level = -1;
      ref_frame_map_pairs[4].pyr_level = -1;
      ref_frame_map_pairs[4].disp_order = -1;
      ref_frame_map_pairs[5].disp_order = -1;
      ref_frame_map_pairs[3].pyr_level = -1;
      ref_frame_map_pairs[2].pyr_level = -1;
      ref_frame_map_pairs[2].disp_order = -1;
      ref_frame_map_pairs[3].disp_order = -1;
      ref_frame_map_pairs[1].pyr_level = -1;
      ref_frame_map_pairs[0].pyr_level = -1;
      ref_frame_map_pairs[0].disp_order = -1;
      ref_frame_map_pairs[1].disp_order = -1;
    }
    else {
      ref_frame_map_pairs[6].pyr_level = 0;
      ref_frame_map_pairs[6].disp_order = 0;
      ref_frame_map_pairs[7].pyr_level = 0;
      ref_frame_map_pairs[7].disp_order = 0;
      ref_frame_map_pairs[4].pyr_level = 0;
      ref_frame_map_pairs[4].disp_order = 0;
      ref_frame_map_pairs[5].pyr_level = 0;
      ref_frame_map_pairs[5].disp_order = 0;
      ref_frame_map_pairs[2].pyr_level = 0;
      ref_frame_map_pairs[2].disp_order = 0;
      ref_frame_map_pairs[3].pyr_level = 0;
      ref_frame_map_pairs[3].disp_order = 0;
      ref_frame_map_pairs[0].pyr_level = 0;
      ref_frame_map_pairs[0].disp_order = 0;
      ref_frame_map_pairs[1].pyr_level = 0;
      ref_frame_map_pairs[1].disp_order = 0;
      for (lVar27 = 0; lVar27 != 8; lVar27 = lVar27 + 1) {
        if (ref_frame_map_pairs[lVar27].disp_order != -1) {
          pRVar7 = (cpi->common).ref_frame_map[lVar27];
          if (pRVar7 == (RefCntBuffer *)0x0) {
            ref_frame_map_pairs[lVar27].disp_order = -1;
            uVar18 = 0xffffffff;
          }
          else {
            lVar34 = lVar27;
            if (1 < pRVar7->ref_count) {
              for (; lVar34 != 7; lVar34 = lVar34 + 1) {
                if ((cpi->common).ref_frame_map[lVar34 + 1] == pRVar7) {
                  ref_frame_map_pairs[lVar34 + 1].pyr_level = -1;
                  ref_frame_map_pairs[lVar34 + 1].disp_order = -1;
                }
              }
            }
            ref_frame_map_pairs[lVar27].disp_order = pRVar7->display_order_hint;
            uVar18 = pRVar7->pyramid_level;
          }
          ref_frame_map_pairs[lVar27].pyr_level = uVar18;
        }
      }
    }
    pEVar33 = frame_params;
    pEVar37 = &frame_params_1;
    for (lVar27 = 0x13; lVar27 != 0; lVar27 = lVar27 + -1) {
      pEVar37->error_resilient_mode = pEVar33->error_resilient_mode;
      pEVar33 = (EncodeFrameParams *)((long)pEVar33 + (ulong)bVar35 * -8 + 4);
      pEVar37 = (EncodeFrameParams *)((long)pEVar37 + (ulong)bVar35 * -8 + 4);
    }
    uVar18 = 0xffffffff;
    lVar27 = 0x1e090;
    FVar2 = frame_params_1.frame_type;
    uVar36 = 0;
    for (lVar34 = 0; lVar34 != -0x300; lVar34 = lVar34 + -0x60) {
      if (FVar2 == '\0') {
        pTVar8 = (pAVar6->tpl_data).tpl_frame;
        *(undefined4 *)((long)pTVar8->ref_map_index + lVar34 + -0x28) = 0;
        *(undefined1 (*) [16])((long)pTVar8->ref_map_index + lVar34 + -0x70) = (undefined1  [16])0x0
        ;
        uVar41 = uVar18;
      }
      else {
        pTVar8 = (pAVar6->tpl_data).tpl_frame;
        *(long *)((long)pTVar8->ref_map_index + lVar34 + -0x70) =
             *(long *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar27 * 2) +
             0x4e0;
        *(long *)((long)pTVar8->ref_map_index + lVar34 + -0x68) =
             *(long *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar27 * 2) +
             0x4e0;
        *(undefined4 *)((long)pTVar8->ref_map_index + lVar34 + -0x28) =
             *(undefined4 *)
              (*(long *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar27 * 2) +
              0x24);
        uVar41 = ~uVar36;
      }
      *(uint *)((long)auStackY_1e248 + lVar27) = uVar41;
      uVar36 = uVar36 + 1;
      uVar18 = uVar18 - 1;
      lVar27 = lVar27 + 4;
    }
    uVar18 = (pAVar5->gf_group).size;
    if (0x5e < (int)uVar18) {
      uVar18 = 0x5f;
    }
    uVar32 = 0;
    if (0 < (int)uVar18) {
      uVar32 = (ulong)uVar18;
    }
    lVar27 = 0x20;
    local_284 = 0;
    iVar26 = 0;
    for (local_280 = 0; local_258 = (long)iVar26, local_280 != uVar32; local_280 = local_280 + 1) {
      pTVar8 = (pAVar6->tpl_data).tpl_frame;
      bVar35 = (pAVar5->gf_group).update_type[local_280];
      frame_params_1.show_frame = (int)(bVar35 != 6 && bVar35 != 3);
      frame_params_1.show_existing_frame = (int)((bVar35 & 0xfe) == 4);
      frame_params_1.frame_type = (pAVar5->gf_group).frame_type[local_280];
      if (bVar35 == 1) {
        local_284 = (pAVar5->gf_group).q_val[local_280];
      }
      iVar43 = (uint)(pAVar5->gf_group).arf_src_offset[local_280] +
               (uint)(pAVar5->gf_group).cur_frame_idx[local_280];
      plVar21 = av1_lookahead_peek(cpi->ppi->lookahead,iVar43,cpi->compressor_stage);
      pAVar38 = cpi->ppi;
      iVar15 = (int)local_280;
      if (plVar21 == (lookahead_entry *)0x0) {
        uVar32 = local_280 & 0xffffffff;
        goto LAB_00213159;
      }
      pTVar8[local_280].gf_picture = &plVar21->img;
      pYVar22 = av1_tf_info_get_filtered_buf(&pAVar38->tf_info,iVar15,&local_90);
      if (pYVar22 != (YV12_BUFFER_CONFIG *)0x0) {
        pTVar8[local_280].gf_picture = pYVar22;
      }
      uVar44 = iVar43 + (cpi->common).current_frame.frame_number;
      pTVar8[local_280].frame_display_index = uVar44;
      if ((byte)(bVar35 - 6) < 0xfe) {
        pTVar8[local_280].rec_picture = (pAVar6->tpl_data).tpl_rec_pool + local_258;
        pTVar8[local_280].tpl_stats_ptr = (pAVar6->tpl_data).tpl_stats_pool[local_258];
        iVar26 = iVar26 + 1;
      }
      av1_get_ref_frames(ref_frame_map_pairs,uVar44,cpi,iVar15,0,remapped_ref_idx);
      iVar43 = av1_get_refresh_frame_flags
                         (cpi,&frame_params_1,bVar35,iVar15,uVar44,ref_frame_map_pairs);
      if ((cpi->ppi->gf_group).is_frame_non_ref[local_280] != false) {
        iVar43 = 0;
      }
      iVar14 = av1_get_refresh_ref_frame_map(iVar43);
      if (iVar14 != -1 && iVar14 < 8) {
        iVar16 = 1;
        bVar45 = uVar44 != 0;
        if ((int)uVar44 < 1) {
          uVar44 = 0;
        }
        ref_frame_map_pairs[iVar14].disp_order = uVar44;
        if (bVar45) {
          iVar16 = (pAVar5->gf_group).layer_depth[local_280];
          if (iVar16 == 6) {
            iVar16 = (cpi->ppi->gf_group).max_layer_depth;
          }
          else if (iVar16 == 7) {
            iVar16 = 1;
          }
          else if (iVar16 < 2) {
            iVar16 = 1;
          }
        }
        ref_frame_map_pairs[iVar14].pyr_level = iVar16;
      }
      for (lVar34 = 0; lVar34 != 7; lVar34 = lVar34 + 1) {
        *(int *)((long)pTVar8->ref_map_index + lVar34 * 4 + lVar27 + -0x20) =
             ref_picture_map[remapped_ref_idx[lVar34]];
      }
      if (iVar43 != 0) {
        ref_picture_map[iVar14] = iVar15;
      }
      lVar27 = lVar27 + 0x60;
    }
    pAVar38 = cpi->ppi;
    local_280 = uVar32;
LAB_00213159:
    iVar26 = (cpi->rc).frames_to_key - (pAVar38->p_rc).baseline_gf_interval;
    iVar15 = (cpi->oxcf).gf_cfg.lag_in_frames + -0x20;
    if (iVar15 < iVar26) {
      iVar26 = iVar15;
    }
    iVar43 = (uint)(pAVar5->gf_group).arf_src_offset[(long)(int)uVar18 + -1] +
             (uint)(pAVar5->gf_group).cur_frame_idx[(long)(int)uVar18 + -1];
    lVar27 = uVar32 * 0x60 + 0x20;
    iVar15 = 0;
    while( true ) {
      iVar14 = (int)local_280;
      if ((0x5f < uVar32) || (iVar26 <= iVar15)) goto LAB_0021339c;
      pTVar8 = (pAVar6->tpl_data).tpl_frame;
      frame_params_1.show_frame = 1;
      frame_params_1.show_existing_frame = 0;
      iVar43 = iVar43 + 1;
      frame_params_1.frame_type = '\x01';
      plVar21 = av1_lookahead_peek(pAVar38->lookahead,iVar43,cpi->compressor_stage);
      if (plVar21 == (lookahead_entry *)0x0) break;
      pTVar8[uVar32].gf_picture = &plVar21->img;
      pTVar8[uVar32].rec_picture = (pAVar6->tpl_data).tpl_rec_pool + local_258;
      pTVar8[uVar32].tpl_stats_ptr = (pAVar6->tpl_data).tpl_stats_pool[local_258];
      pTVar8[uVar32].frame_display_index = (cpi->common).current_frame.frame_number + iVar43;
      (pAVar5->gf_group).update_type[uVar32] = '\x01';
      (pAVar5->gf_group).q_val[uVar32] = local_284;
      uVar44 = pTVar8[uVar32].frame_display_index;
      iVar19 = (int)uVar32;
      av1_get_ref_frames(ref_frame_map_pairs,uVar44,cpi,iVar19,0,remapped_ref_idx);
      iVar16 = av1_get_refresh_frame_flags
                         (cpi,&frame_params_1,'\x01',iVar19,uVar44,ref_frame_map_pairs);
      iVar17 = av1_get_refresh_ref_frame_map(iVar16);
      if (iVar17 != -1 && iVar17 < 8) {
        iVar20 = 1;
        bVar45 = uVar44 != 0;
        if ((int)uVar44 < 1) {
          uVar44 = 0;
        }
        ref_frame_map_pairs[iVar17].disp_order = uVar44;
        if (bVar45) {
          iVar20 = (pAVar5->gf_group).layer_depth[uVar32];
          if (iVar20 == 6) {
            iVar20 = (cpi->ppi->gf_group).max_layer_depth;
          }
          else if (iVar20 == 7) {
            iVar20 = 1;
          }
          else if (iVar20 < 2) {
            iVar20 = 1;
          }
        }
        ref_frame_map_pairs[iVar17].pyr_level = iVar20;
      }
      local_258 = local_258 + 1;
      for (lVar34 = 0; lVar34 != 7; lVar34 = lVar34 + 1) {
        *(int *)((long)pTVar8->ref_map_index + lVar34 * 4 + lVar27 + -0x20) =
             ref_picture_map[remapped_ref_idx[lVar34]];
      }
      pTVar8[uVar32].ref_map_index[6] = -1;
      pTVar8[uVar32].ref_map_index[2] = -1;
      pTVar8[uVar32].ref_map_index[4] = -1;
      pTVar8[uVar32].ref_map_index[5] = -1;
      if (iVar16 != 0) {
        ref_picture_map[iVar17] = iVar19;
      }
      local_280 = (ulong)(iVar14 + 1);
      iVar15 = iVar15 + 1;
      uVar32 = uVar32 + 1;
      pAVar38 = cpi->ppi;
      lVar27 = lVar27 + 0x60;
    }
    pAVar38 = cpi->ppi;
LAB_0021339c:
    (pAVar38->p_rc).base_layer_qp = local_284;
    av1_init_tpl_stats(tpl_data);
    tpl_tmp_buffers = &(cpi->td).tpl_tmp_buffers;
    uVar18 = (uint)(pAVar5->tpl_data).tpl_bsize_1d;
    iVar26 = uVar18 * uVar18;
    uVar32 = (ulong)(uint)(iVar26 * 2);
    puVar23 = (uint8_t *)aom_memalign(0x20,uVar32);
    (cpi->td).tpl_tmp_buffers.predictor8 = puVar23;
    piVar24 = (int16_t *)aom_memalign(0x20,uVar32);
    (cpi->td).tpl_tmp_buffers.src_diff = piVar24;
    uVar32 = (ulong)(uint)(iVar26 * 4);
    ptVar25 = (tran_low_t *)aom_memalign(0x20,uVar32);
    (cpi->td).tpl_tmp_buffers.coeff = ptVar25;
    ptVar25 = (tran_low_t *)aom_memalign(0x20,uVar32);
    (cpi->td).tpl_tmp_buffers.qcoeff = ptVar25;
    ptVar25 = (tran_low_t *)aom_memalign(0x20,uVar32);
    (cpi->td).tpl_tmp_buffers.dqcoeff = ptVar25;
    if (((((cpi->td).tpl_tmp_buffers.predictor8 == (uint8_t *)0x0) ||
         ((cpi->td).tpl_tmp_buffers.src_diff == (int16_t *)0x0)) ||
        ((cpi->td).tpl_tmp_buffers.coeff == (tran_low_t *)0x0)) ||
       (((cpi->td).tpl_tmp_buffers.qcoeff == (tran_low_t *)0x0 || (ptVar25 == (tran_low_t *)0x0))))
    {
      tpl_dealloc_temp_buffers(tpl_tmp_buffers);
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Error allocating tpl data");
    }
    (cpi->mt_info).tpl_row_mt.sync_read_ptr = av1_tpl_row_mt_sync_read_dummy;
    (cpi->mt_info).tpl_row_mt.sync_write_ptr = av1_tpl_row_mt_sync_write_dummy;
    iVar26 = (cpi->common).width;
    iVar15 = (cpi->common).height;
    av1_setup_scale_factors_for_frame(&(cpi->common).sf_identity,iVar26,iVar15,iVar26,iVar15);
    if (frame_params->frame_type == '\0') {
      av1_init_mv_probs(&cpi->common);
    }
    av1_fill_mv_costs(&((cpi->common).fc)->nmvc,
                      (uint)(cpi->common).features.cur_frame_force_integer_mv,
                      (uint)(cpi->common).features.allow_high_precision_mv,(cpi->td).mb.mv_costs);
    if ((cpi->sf).tpl_sf.use_y_only_rate_distortion == 0) {
      iVar26 = (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
    }
    else {
      iVar26 = 1;
    }
    uVar32 = (ulong)cpi->gf_frame_index;
    dVar47 = 1.0;
    if (((cpi->sf).tpl_sf.reduce_num_frames == 0) || (gf_group->update_type[uVar32] == '\0')) {
      iVar15 = 0;
    }
    else {
      iVar15 = 0;
      if (2 < (pAVar5->gf_group).max_layer_depth) {
        dVar47 = 1.6;
        iVar15 = 1;
      }
    }
    (pAVar5->tpl_data).r0_adjust_factor = dVar47;
    lVar27 = uVar32 * 0x60 + 0x20;
    for (; uVar32 < (local_280 & 0xffffffff); uVar32 = uVar32 + 1) {
      iVar43 = skip_tpl_for_frame(gf_group,(int)uVar32,gop_eval,(uint)(1 < gop_eval),iVar15);
      if (iVar43 == 0) {
        pAVar6 = cpi->ppi;
        bVar45 = false;
        if ((0 < (cpi->sf).inter_sf.selective_ref_frame) &&
           (0 < (cpi->sf).tpl_sf.prune_ref_frames_in_tpl)) {
          bVar35 = (pAVar6->gf_group).update_type[uVar32 & 0xff];
          bVar45 = bVar35 != 0 && (bVar35 & 0xfe) != 2;
        }
        pTVar9 = (pAVar6->tpl_data).tpl_frame;
        pTVar8 = pTVar9 + uVar32;
        pYVar22 = pTVar9[uVar32].gf_picture;
        iVar43 = (pAVar6->gf_group).size;
        (pAVar6->tpl_data).frame_idx = (int)uVar32;
        for (lVar34 = -7; lVar34 != 0; lVar34 = lVar34 + 1) {
          piVar1 = (pAVar6->mv_stats).mv_joint_count + lVar34 * 2 + -0x14;
          piVar1[0] = 0;
          piVar1[1] = 0;
          (pAVar6->tpl_data).ref_frame[lVar34] = (YV12_BUFFER_CONFIG *)0x0;
        }
        av1_tile_init(&(cpi->td).mb.e_mbd.tile,&cpi->common,0,0);
        iVar16 = (cpi->ppi->p_rc).gfu_boost;
        iVar17 = (pAVar6->gf_group).layer_depth[cpi->gf_frame_index];
        FVar2 = (cpi->common).current_frame.frame_type;
        sf = &(pAVar6->tpl_data).sf;
        iVar19 = (pYVar22->field_2).field_0.y_crop_width;
        iVar20 = (pYVar22->field_3).field_0.y_crop_height;
        av1_setup_scale_factors_for_frame(sf,iVar19,iVar20,iVar19,iVar20);
        (cpi->td).mb.e_mbd.cur_buf = pYVar22;
        pTVar10 = (pAVar6->tpl_data).tpl_frame;
        for (lVar34 = 0; iVar20 = remapped_ref_idx[3], iVar19 = remapped_ref_idx[0], lVar34 != 7;
            lVar34 = lVar34 + 1) {
          iVar19 = *(int *)((long)pTVar9->ref_map_index + lVar34 * 4 + lVar27 + -0x20);
          (pAVar6->tpl_data).ref_frame[lVar34] = pTVar10[iVar19].rec_picture;
          (pAVar6->tpl_data).src_ref_frame[lVar34] = pTVar10[iVar19].gf_picture;
          remapped_ref_idx[lVar34] = pTVar10[iVar19].frame_display_index;
        }
        if (0x5e < iVar43) {
          iVar43 = 0x5f;
        }
        for (lVar34 = 0; lVar34 != 7; lVar34 = lVar34 + 1) {
          ref_frame_map_pairs[lVar34] =
               *(RefFrameMapPair *)
                ((pAVar6->tpl_data).src_ref_frame + (long)"\x01\a\x05\x04\x06\x02\x03"[lVar34] + 6);
        }
        iVar30 = iVar16 / 100;
        if (0x63f < iVar16) {
          iVar30 = 0xf;
        }
        if (5 < iVar17) {
          iVar17 = 6;
        }
        aVar4 = (cpi->oxcf).pass;
        if (aVar4 == AOM_RC_ONE_PASS) {
          if ((cpi->ppi->lap_enabled == 0) && ((cpi->oxcf).mode == '\x01')) {
            bVar46 = (cpi->oxcf).gf_cfg.lag_in_frames == 0;
          }
          else {
            bVar46 = false;
          }
        }
        else {
          bVar46 = false;
        }
        uVar18 = (cpi->ext_flags).ref_frame_flags;
        for (lVar34 = 1; lVar34 != 7; lVar34 = lVar34 + 1) {
          uVar36 = (uint)lVar34;
          if (lVar34 == 3 && bVar46) {
            uVar36 = (cpi->sf).rt_sf.use_nonrd_altref_frame + 1;
          }
          uVar28 = (ulong)uVar36;
          if ((int)uVar36 < 1) {
            uVar28 = 0;
          }
          for (uVar42 = 0; uVar28 != uVar42; uVar42 = uVar42 + 1) {
            if ((ref_frame_map_pairs[lVar34] == ref_frame_map_pairs[uVar42]) &&
               ((uVar18 >> ((byte)("\x01\a\x05\x04\x06\x02\x03"[uVar42] - 1) & 0x1f) & 1) != 0)) {
              uVar18 = uVar18 & ~(1 << ((byte)("\x01\a\x05\x04\x06\x02\x03"[lVar34] - 1) & 0x1f));
              break;
            }
          }
        }
        iVar16 = 0;
        for (lVar34 = 1; lVar34 != 8; lVar34 = lVar34 + 1) {
          iVar16 = (iVar16 + 1) - (uint)((""[lVar34] & uVar18) == 0);
        }
        uVar36 = (cpi->oxcf).ref_frm_cfg.max_reference_frames;
        uVar41 = (cpi->sf).inter_sf.selective_ref_frame;
        uVar40 = 7;
        if (2 < (int)uVar41) {
          uVar40 = 4;
          if (((uVar41 < 6) && (uVar40 = 6, uVar41 == 5)) && ((uVar18 & 2) != 0)) {
            uVar40 = remapped_ref_idx[1] - pTVar8->frame_display_index;
            uVar12 = -uVar40;
            if (0 < (int)uVar40) {
              uVar12 = uVar40;
            }
            uVar40 = 5;
            if ((uVar12 < 3) && (uVar40 = 6, AOM_RC_FIRST_PASS < aVar4)) {
              pSVar11 = (cpi->ppi->twopass).stats_buf_ctx;
              pFVar39 = pSVar11->stats_in_start + pTVar8->frame_display_index;
              pFVar29 = (FIRSTPASS_STATS *)0x0;
              if (pFVar39 <= pSVar11->stats_in_end) {
                pFVar29 = pFVar39;
              }
              uVar40 = (100.0 < pFVar29->coded_error || pFVar29->coded_error == 100.0) + 5;
            }
          }
        }
        if (uVar40 < uVar36) {
          uVar36 = uVar40;
        }
        uVar28 = 0;
        while ((uVar28 < 4 && ((int)uVar36 < iVar16))) {
          if ((uVar18 & ""["\x03\x02\x06\x05"[uVar28]]) != 0) {
            bVar35 = "\x03\x02\x06\x05"[uVar28] - 2;
            if ((bVar35 < 5) && ((0x1bU >> (bVar35 & 0x1f) & 1) != 0)) {
              uVar18 = uVar18 & (&DAT_004651a8)[bVar35];
            }
            iVar16 = iVar16 + -1;
          }
          uVar28 = uVar28 + 1;
        }
        for (lVar34 = 0; lVar34 != 7; lVar34 = lVar34 + 1) {
          if ((uVar18 >> ((uint)lVar34 & 0x1f) & 1) == 0) {
            (pAVar6->tpl_data).ref_frame[lVar34] = (YV12_BUFFER_CONFIG *)0x0;
          }
        }
        if ((bool)(bVar45 & (long)uVar32 < (long)iVar43)) {
          for (lVar34 = 0; lVar34 != 7; lVar34 = lVar34 + 1) {
            ref_picture_map[0]._1_1_ = 0xff;
            ref_picture_map[0]._0_1_ = (char)lVar34 + '\x01';
            if (1 < (int)uVar41) {
              frame_params_1.error_resilient_mode = 3;
              frame_params_1.frame_type = '\x02';
              frame_params_1._5_3_ = 0;
              iVar43 = prune_ref((MV_REFERENCE_FRAME *)ref_picture_map,(uint *)remapped_ref_idx,
                                 iVar20,&frame_params_1.error_resilient_mode);
              if (iVar43 == 0) {
                if (uVar41 != 2) {
                  frame_params_1.error_resilient_mode = 6;
                  frame_params_1.frame_type = '\x05';
                  frame_params_1._5_3_ = 0;
                  iVar43 = prune_ref((MV_REFERENCE_FRAME *)ref_picture_map,(uint *)remapped_ref_idx,
                                     iVar19,&frame_params_1.error_resilient_mode);
                  if (iVar43 != 0) goto LAB_002139cb;
                }
              }
              else {
LAB_002139cb:
                (pAVar6->tpl_data).ref_frame[lVar34] = (YV12_BUFFER_CONFIG *)0x0;
              }
            }
          }
        }
        memset(&frame_params_1,0,0xb0);
        (cpi->td).mb.e_mbd.mi = (MB_MODE_INFO **)ref_picture_map;
        (cpi->td).mb.e_mbd.block_ref_scale_factors[0] = sf;
        (cpi->td).mb.e_mbd.block_ref_scale_factors[1] = sf;
        iVar43 = local_284;
        if (cpi->use_ducky_encode != 0) {
          iVar43 = (pAVar6->gf_group).q_val[uVar32];
        }
        bit_depth = ((cpi->common).seq_params)->bit_depth;
        update_type = (cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
        iVar16 = (cpi->oxcf).q_cfg.use_fixed_qp_offsets;
        ref_picture_map._0_8_ = &frame_params_1;
        iVar19 = is_stat_consumption_stage(cpi);
        uVar18 = av1_compute_rd_mult(iVar43,bit_depth,update_type,iVar17,iVar30,FVar2,iVar16,iVar19,
                                     (cpi->oxcf).tune_cfg.tuning);
        if ((int)uVar18 < 2) {
          uVar18 = 0;
        }
        (cpi->td).mb.errorperbit = (uVar18 >> 6) + (uint)(uVar18 >> 6 == 0);
        av1_set_sad_per_bit(cpi,&(cpi->td).mb.sadperbit,iVar43);
        pTVar8->is_valid = '\x01';
        (cpi->common).quant_params.base_qindex = iVar43;
        av1_frame_init_quantizer(cpi);
        iVar43 = av1_compute_rd_mult_based_on_qindex
                           ((cpi->td).mb.e_mbd.bd,
                            (pAVar6->gf_group).update_type[cpi->gf_frame_index],iVar43,
                            (cpi->oxcf).tune_cfg.tuning);
        pTVar8->base_rdmult = iVar43 / 6;
        if (cpi->use_ducky_encode != 0) {
          pTVar8->base_rdmult = (pAVar6->gf_group).rdmult_val[uVar32];
        }
        (cpi->td).tpl_txfm_stats.ready = 0;
        (cpi->td).tpl_txfm_stats.coeff_num = 0x100;
        memset((cpi->td).tpl_txfm_stats.abs_coeff_sum,0,0x1004);
        if ((cpi->sf).tpl_sf.allow_compound_pred != 0) {
          memset(&(cpi->td).mb.mbmi_ext,0,0x504);
        }
        (cpi->td).mb.e_mbd.mi = (MB_MODE_INFO **)0x0;
        iVar43 = (cpi->sf).tpl_sf.use_sad_for_mode_decision;
        uVar18 = 0;
        if ((iVar43 != 0) && ((pAVar6->gf_group).update_type[cpi->gf_frame_index] != '\0')) {
          uVar18 = (uint)(iVar43 == 1);
          iVar43 = (pAVar6->gf_group).layer_depth[uVar32];
          uVar18 = (uint)(SBORROW4(iVar43,uVar18 * 5) == (int)(iVar43 + uVar18 * -5) < 0);
        }
        pTVar8->use_pred_sad = uVar18;
        if ((cpi->mt_info).num_workers < 2) {
          BVar13 = convert_length_to_bsize((uint)(cpi->ppi->tpl_data).tpl_bsize_1d);
          tx_size = ""[BVar13];
          bVar35 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [BVar13];
          iVar17 = 0;
          iVar19 = 0;
          iVar16 = 8;
          iVar43 = 0;
          while (iVar20 = (cpi->common).mi_params.mi_rows, iVar43 < iVar20) {
            iVar30 = (cpi->ppi->tpl_data).border_in_pixels;
            uVar18 = iVar16 - iVar30;
            uVar36 = ((uint)bVar35 * -4 + iVar16) - 0x10;
            if ((int)uVar18 <= (int)uVar36) {
              uVar18 = uVar36;
            }
            (cpi->td).mb.mv_limits.row_min = uVar18;
            iVar20 = iVar20 + iVar17;
            iVar31 = iVar20 - (uint)bVar35;
            iVar30 = iVar30 + iVar31 * 4 + -8;
            iVar20 = iVar20 * 4 + 8;
            if (iVar30 < iVar20) {
              iVar20 = iVar30;
            }
            (cpi->td).mb.mv_limits.row_max = iVar20;
            (cpi->td).mb.e_mbd.mb_to_top_edge = iVar19;
            (cpi->td).mb.e_mbd.mb_to_bottom_edge = iVar31 * 0x20;
            av1_mc_flow_dispenser_row
                      (cpi,(TplTxfmStats *)(ulong)uVar36,tpl_tmp_buffers,&(cpi->td).mb,iVar43,BVar13
                       ,tx_size);
            iVar16 = iVar16 + (uint)bVar35 * -4;
            iVar19 = iVar19 + (uint)bVar35 * -0x20;
            iVar17 = iVar17 - (uint)bVar35;
            iVar43 = iVar43 + (uint)bVar35;
          }
        }
        else {
          (cpi->mt_info).tpl_row_mt.sync_read_ptr = av1_tpl_row_mt_sync_read;
          (cpi->mt_info).tpl_row_mt.sync_write_ptr = av1_tpl_row_mt_sync_write;
          av1_mc_flow_dispenser_mt(cpi);
        }
        aom_extend_frame_borders_c((pAVar5->tpl_data).tpl_frame[uVar32].rec_picture,iVar26);
      }
      lVar27 = lVar27 + 0x60;
    }
    local_280 = local_280 & 0xffffffff;
    while( true ) {
      if ((int)local_280 <= (int)(uint)cpi->gf_frame_index) break;
      uVar18 = (int)local_280 - 1;
      local_280 = (ulong)uVar18;
      iVar26 = skip_tpl_for_frame(gf_group,uVar18,gop_eval,(uint)(1 < gop_eval),iVar15);
      if ((iVar26 == 0) && (uVar18 != 0)) {
        iVar26 = (cpi->common).mi_params.mi_rows;
        iVar43 = (cpi->common).mi_params.mi_cols;
        BVar13 = convert_length_to_bsize((uint)(pAVar5->tpl_data).tpl_bsize_1d);
        bVar35 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [BVar13];
        bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar13]
        ;
        for (iVar16 = 0; iVar16 < iVar26; iVar16 = iVar16 + (uint)bVar35) {
          for (iVar17 = 0; iVar17 < iVar43; iVar17 = iVar17 + (uint)bVar3) {
            BVar13 = convert_length_to_bsize
                               (4 << ((pAVar5->tpl_data).tpl_stats_block_mis_log2 & 0x1f));
            tpl_model_update_b(tpl_data,iVar16,iVar17,BVar13,uVar18,0);
            tpl_model_update_b(tpl_data,iVar16,iVar17,BVar13,uVar18,1);
          }
        }
      }
    }
    av1_configure_buffer_updates
              (cpi,&this_frame_params.refresh_frame,gf_group->update_type[cpi->gf_frame_index],
               gf_group->update_type[cpi->gf_frame_index],0);
    (cpi->common).current_frame.frame_type = frame_params->frame_type;
    (cpi->common).show_frame = frame_params->show_frame;
    tpl_dealloc_temp_buffers(tpl_tmp_buffers);
    if (gop_eval < 2) {
      tpl_data->ready = 1;
    }
    uVar18 = 0;
    if ((cpi->common).tiles.large_scale == 0) {
      if ((pAVar5->gf_group).max_layer_depth_allowed == 0) {
        uVar18 = 1;
      }
      else {
        uVar18 = 0;
        if (gop_eval != 0) {
          iVar15 = (pAVar5->gf_group).arf_index;
          iVar26 = iVar15 + 1;
          iVar43 = iVar14 + -1;
          if (iVar26 < iVar14) {
            iVar43 = iVar26;
          }
          dVar47 = get_frame_importance(tpl_data,iVar15);
          dVar48 = get_frame_importance(tpl_data,iVar43);
          if (gop_eval == 3) {
            uVar18 = (uint)(1.1 < dVar47);
          }
          else if (gop_eval == 2) {
            if ((dVar47 <= 1.6) || (uVar18 = 1, dVar47 < dVar48 + 0.4)) {
              uVar18 = (-(uint)(dVar48 + 0.1 <= dVar47 && 1.4 < dVar47) & 1) * 2;
            }
          }
          else if (gop_eval == 1) {
            uVar18 = -(uint)(3.0 < dVar47 && dVar48 + 0.7 <= dVar47) & 1;
          }
          else {
            uVar18 = 2;
          }
        }
      }
    }
  }
  else {
    av1_init_tpl_stats(tpl_data);
    uVar18 = 0;
  }
  return uVar18;
}

Assistant:

int av1_tpl_setup_stats(AV1_COMP *cpi, int gop_eval,
                        const EncodeFrameParams *const frame_params) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_tpl_setup_stats_time);
#endif
  assert(cpi->gf_frame_index == 0);
  AV1_COMMON *cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1TplRowMultiThreadInfo *const tpl_row_mt = &mt_info->tpl_row_mt;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  EncodeFrameParams this_frame_params = *frame_params;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  int approx_gop_eval = (gop_eval > 1);

  if (cpi->superres_mode != AOM_SUPERRES_NONE) {
    assert(cpi->superres_mode != AOM_SUPERRES_AUTO);
    av1_init_tpl_stats(tpl_data);
    return 0;
  }

  cm->current_frame.frame_type = frame_params->frame_type;
  for (int gf_index = cpi->gf_frame_index; gf_index < gf_group->size;
       ++gf_index) {
    cm->current_frame.frame_type = gf_group->frame_type[gf_index];
    av1_configure_buffer_updates(cpi, &this_frame_params.refresh_frame,
                                 gf_group->update_type[gf_index],
                                 gf_group->refbuf_state[gf_index], 0);

    memcpy(&cpi->refresh_frame, &this_frame_params.refresh_frame,
           sizeof(cpi->refresh_frame));
  }

  int pframe_qindex;
  int tpl_gf_group_frames;
  init_gop_frames_for_tpl(cpi, frame_params, gf_group, &tpl_gf_group_frames,
                          &pframe_qindex);

  cpi->ppi->p_rc.base_layer_qp = pframe_qindex;

  av1_init_tpl_stats(tpl_data);

  TplBuffers *tpl_tmp_buffers = &cpi->td.tpl_tmp_buffers;
  if (!tpl_alloc_temp_buffers(tpl_tmp_buffers, tpl_data->tpl_bsize_1d)) {
    aom_internal_error(cpi->common.error, AOM_CODEC_MEM_ERROR,
                       "Error allocating tpl data");
  }

  tpl_row_mt->sync_read_ptr = av1_tpl_row_mt_sync_read_dummy;
  tpl_row_mt->sync_write_ptr = av1_tpl_row_mt_sync_write_dummy;

  av1_setup_scale_factors_for_frame(&cm->sf_identity, cm->width, cm->height,
                                    cm->width, cm->height);

  if (frame_params->frame_type == KEY_FRAME) {
    av1_init_mv_probs(cm);
  }
  av1_fill_mv_costs(&cm->fc->nmvc, cm->features.cur_frame_force_integer_mv,
                    cm->features.allow_high_precision_mv, cpi->td.mb.mv_costs);

  const int num_planes =
      cpi->sf.tpl_sf.use_y_only_rate_distortion ? 1 : av1_num_planes(cm);
  // As tpl module is called before the setting of speed features at frame
  // level, turning off this speed feature for the first GF group of the
  // key-frame interval is done here.
  int reduce_num_frames =
      cpi->sf.tpl_sf.reduce_num_frames &&
      gf_group->update_type[cpi->gf_frame_index] != KF_UPDATE &&
      gf_group->max_layer_depth > 2;
  // TPL processing is skipped for frames of type LF_UPDATE when
  // 'reduce_num_frames' is 1, which affects the r0 calcuation. Thus, a factor
  // to adjust r0 is used. The value of 1.6 corresponds to using ~60% of the
  // frames in the gf group on an average.
  tpl_data->r0_adjust_factor = reduce_num_frames ? 1.6 : 1.0;

  // Backward propagation from tpl_group_frames to 1.
  for (int frame_idx = cpi->gf_frame_index; frame_idx < tpl_gf_group_frames;
       ++frame_idx) {
    if (skip_tpl_for_frame(gf_group, frame_idx, gop_eval, approx_gop_eval,
                           reduce_num_frames))
      continue;

    init_mc_flow_dispenser(cpi, frame_idx, pframe_qindex);
    if (mt_info->num_workers > 1) {
      tpl_row_mt->sync_read_ptr = av1_tpl_row_mt_sync_read;
      tpl_row_mt->sync_write_ptr = av1_tpl_row_mt_sync_write;
      av1_mc_flow_dispenser_mt(cpi);
    } else {
      mc_flow_dispenser(cpi);
    }
#if CONFIG_BITRATE_ACCURACY
    av1_tpl_txfm_stats_update_abs_coeff_mean(&cpi->td.tpl_txfm_stats);
    av1_tpl_store_txfm_stats(tpl_data, &cpi->td.tpl_txfm_stats, frame_idx);
#endif  // CONFIG_BITRATE_ACCURACY
#if CONFIG_RATECTRL_LOG && CONFIG_THREE_PASS && CONFIG_BITRATE_ACCURACY
    if (cpi->oxcf.pass == AOM_RC_THIRD_PASS) {
      int frame_coding_idx =
          av1_vbr_rc_frame_coding_idx(&cpi->vbr_rc_info, frame_idx);
      rc_log_frame_stats(&cpi->rc_log, frame_coding_idx,
                         &cpi->td.tpl_txfm_stats);
    }
#endif  // CONFIG_RATECTRL_LOG

    aom_extend_frame_borders(tpl_data->tpl_frame[frame_idx].rec_picture,
                             num_planes);
  }

  for (int frame_idx = tpl_gf_group_frames - 1;
       frame_idx >= cpi->gf_frame_index; --frame_idx) {
    if (skip_tpl_for_frame(gf_group, frame_idx, gop_eval, approx_gop_eval,
                           reduce_num_frames))
      continue;

    mc_flow_synthesizer(tpl_data, frame_idx, cm->mi_params.mi_rows,
                        cm->mi_params.mi_cols);
  }

  av1_configure_buffer_updates(cpi, &this_frame_params.refresh_frame,
                               gf_group->update_type[cpi->gf_frame_index],
                               gf_group->update_type[cpi->gf_frame_index], 0);
  cm->current_frame.frame_type = frame_params->frame_type;
  cm->show_frame = frame_params->show_frame;

#if CONFIG_COLLECT_COMPONENT_TIMING
  // Record the time if the function returns.
  if (cpi->common.tiles.large_scale || gf_group->max_layer_depth_allowed == 0 ||
      !gop_eval)
    end_timing(cpi, av1_tpl_setup_stats_time);
#endif

  tpl_dealloc_temp_buffers(tpl_tmp_buffers);

  if (!approx_gop_eval) {
    tpl_data->ready = 1;
  }
  if (cpi->common.tiles.large_scale) return 0;
  if (gf_group->max_layer_depth_allowed == 0) return 1;
  if (!gop_eval) return 0;
  assert(gf_group->arf_index >= 0);

  double beta[2] = { 0.0 };
  const int frame_idx_0 = gf_group->arf_index;
  const int frame_idx_1 =
      AOMMIN(tpl_gf_group_frames - 1, gf_group->arf_index + 1);
  beta[0] = get_frame_importance(tpl_data, frame_idx_0);
  beta[1] = get_frame_importance(tpl_data, frame_idx_1);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_tpl_setup_stats_time);
#endif
  return eval_gop_length(beta, gop_eval);
}